

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * google::protobuf::compiler::ruby::RubifyConstant_abi_cxx11_(string_view name)

{
  byte bVar1;
  AlphaNum *in_RDI;
  string ret;
  byte *local_a0;
  char *local_98;
  byte local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  AlphaNum local_70;
  char *local_40;
  byte *local_38;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_a0,&local_80,(allocator<char> *)&local_70);
  if (local_98 != (char *)0x0) {
    bVar1 = *local_a0;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      *local_a0 = bVar1 - 0x20;
    }
    else if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
      local_70.piece_ = absl::lts_20240722::NullSafeStringView("PB_");
      local_40 = local_98;
      local_38 = local_a0;
      absl::lts_20240722::StrCat_abi_cxx11_(in_RDI,&local_70);
      goto LAB_0028d6e8;
    }
  }
  (in_RDI->piece_)._M_len = (size_t)in_RDI->digits_;
  if (local_a0 == &local_90) {
    *(ulong *)in_RDI->digits_ = CONCAT71(uStack_8f,local_90);
    *(undefined8 *)(in_RDI->digits_ + 8) = uStack_88;
  }
  else {
    (in_RDI->piece_)._M_len = (size_t)local_a0;
    *(ulong *)in_RDI->digits_ = CONCAT71(uStack_8f,local_90);
  }
  (in_RDI->piece_)._M_str = local_98;
  local_98 = (char *)0x0;
  local_90 = 0;
  local_a0 = &local_90;
LAB_0028d6e8:
  std::__cxx11::string::~string((string *)&local_a0);
  return (string *)in_RDI;
}

Assistant:

std::string RubifyConstant(absl::string_view name) {
  std::string ret(name);
  if (!ret.empty()) {
    if (IsLower(ret[0])) {
      // If it starts with a lowercase letter, capitalize it.
      ret[0] = UpperChar(ret[0]);
    } else if (!IsAlpha(ret[0])) {
      // Otherwise (e.g. if it begins with an underscore), we need to come up
      // with some prefix that starts with a capital letter. We could be smarter
      // here, e.g. try to strip leading underscores, but this may cause other
      // problems if the user really intended the name. So let's just prepend a
      // well-known suffix.
      return absl::StrCat("PB_", ret);
    }
  }

  return ret;
}